

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  undefined1 local_58 [8];
  scoped_padder p;
  uint field_size;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  t_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_._4_4_ = scoped_padder::count_digits<unsigned_long>(msg->thread_id);
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,(ulong)p.spaces_.size_._4_4_,
             &(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_long>(msg->thread_id,dest);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }